

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

void lest::report(ostream *os,message *e,text *test)

{
  ostream *poVar1;
  char *pcVar2;
  allocator local_f9;
  string local_f8 [32];
  text local_d8 [32];
  comment local_b8;
  string local_98 [32];
  text local_78 [48];
  location local_48;
  text *local_20;
  text *test_local;
  message *e_local;
  ostream *os_local;
  
  local_20 = test;
  test_local = (text *)e;
  e_local = (message *)os;
  location::location(&local_48,&e->where);
  poVar1 = operator<<(os,&local_48);
  poVar1 = std::operator<<(poVar1,": ");
  std::__cxx11::string::string(local_98,(string *)(test_local + 0x10));
  colourise(local_78);
  poVar1 = std::operator<<(poVar1,(string *)local_78);
  comment::comment(&local_b8,(comment *)(test_local + 0x58));
  poVar1 = operator<<(poVar1,&local_b8);
  poVar1 = std::operator<<(poVar1,": ");
  poVar1 = std::operator<<(poVar1,(string *)test);
  poVar1 = std::operator<<(poVar1,": ");
  pcVar2 = (char *)(**(code **)(*(long *)test_local + 0x10))();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,pcVar2,&local_f9);
  colourise(local_d8);
  poVar1 = std::operator<<(poVar1,(string *)local_d8);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  comment::~comment(&local_b8);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string(local_98);
  location::~location(&local_48);
  return;
}

Assistant:

inline void report( std::ostream & os, message const & e, text test )
{
    os << e.where << ": " << colourise( e.kind ) << e.note << ": " << test << ": " << colourise( e.what() ) << std::endl;
}